

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  ushort uVar1;
  sqlite3 *psVar2;
  SrcList *pSVar3;
  Column *pCVar4;
  Column *pCVar5;
  char *zLeft;
  char *zRight;
  long lVar6;
  long lVar7;
  Schema *pSVar8;
  char **ppcVar9;
  bool bVar10;
  char cVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iCur;
  int iVar16;
  Trigger *pTVar17;
  Table *pTab;
  Vdbe *p;
  Index *pIVar18;
  int iVar19;
  Schema **ppSVar20;
  Op *pOVar21;
  Index *pSrc;
  u16 uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  Index *local_70;
  int local_64;
  int local_58;
  int local_54;
  int local_50;
  int local_40;
  int local_3c;
  
  if (pSelect == (Select *)0x0) {
    return 0;
  }
  if (pParse->pWith != (With *)0x0) {
    return 0;
  }
  if (pSelect->pWith != (With *)0x0) {
    return 0;
  }
  psVar2 = pParse->db;
  pTVar17 = sqlite3TriggerList(pParse,pDest);
  if (pTVar17 != (Trigger *)0x0) {
    return 0;
  }
  if (pDest->nModuleArg != 0) {
    return 0;
  }
  if (onError == 0xb) {
    if (pDest->iPKey < 0) {
      uVar13 = 0xb;
    }
    else {
      uVar13 = (uint)pDest->keyConf;
    }
    onError = 2;
    if (uVar13 != 0xb) {
      onError = uVar13;
    }
  }
  pSVar3 = pSelect->pSrc;
  if (pSVar3->nSrc != 1) {
    return 0;
  }
  if (pSVar3->a[0].pSelect != (Select *)0x0) {
    return 0;
  }
  if (pSelect->pWhere != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pOrderBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pGroupBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pLimit != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pPrior != (Select *)0x0) {
    return 0;
  }
  if ((pSelect->selFlags & 1) != 0) {
    return 0;
  }
  if (pSelect->pEList->nExpr != 1) {
    return 0;
  }
  if ((pSelect->pEList->a[0].pExpr)->op != 0xa8) {
    return 0;
  }
  pTab = sqlite3LocateTableItem(pParse,0,pSVar3->a);
  if (pTab == pDest || pTab == (Table *)0x0) {
    return 0;
  }
  if (((pTab->tabFlags ^ pDest->tabFlags) & 0x20) != 0) {
    return 0;
  }
  if (pTab->nModuleArg != 0) {
    return 0;
  }
  if (pTab->pSelect != (Select *)0x0) {
    return 0;
  }
  uVar1 = pDest->nCol;
  if (uVar1 != pTab->nCol) {
    return 0;
  }
  if (pDest->iPKey != pTab->iPKey) {
    return 0;
  }
  if (0 < (short)uVar1) {
    pCVar4 = pDest->aCol;
    pCVar5 = pTab->aCol;
    lVar23 = 0;
    do {
      if ((&pCVar4->affinity)[lVar23] != (&pCVar5->affinity)[lVar23]) {
        return 0;
      }
      zLeft = *(char **)((long)&pCVar4->zColl + lVar23);
      zRight = *(char **)((long)&pCVar5->zColl + lVar23);
      if (zLeft == (char *)0x0) {
        iVar14 = -(uint)(zRight != (char *)0x0);
      }
      else if (zRight == (char *)0x0) {
        iVar14 = 1;
      }
      else {
        iVar14 = sqlite3StrICmp(zLeft,zRight);
      }
      if (iVar14 != 0) {
        return 0;
      }
      if (((&pCVar4->notNull)[lVar23] != '\0') && ((&pCVar5->notNull)[lVar23] == '\0')) {
        return 0;
      }
      if (lVar23 != 0) {
        lVar6 = *(long *)((long)&pCVar4->pDflt + lVar23);
        lVar7 = *(long *)((long)&pCVar5->pDflt + lVar23);
        if ((lVar6 == 0) == (lVar7 != 0)) {
          return 0;
        }
        if ((lVar6 != 0) &&
           (iVar14 = strcmp(*(char **)(lVar6 + 8),*(char **)(lVar7 + 8)), iVar14 != 0)) {
          return 0;
        }
      }
      lVar23 = lVar23 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar23);
  }
  local_70 = pDest->pIndex;
  if (local_70 == (Index *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = false;
    do {
      if (local_70->onError != '\0') {
        bVar10 = true;
      }
      pIVar18 = pTab->pIndex;
      while( true ) {
        if (pIVar18 == (Index *)0x0) {
          return 0;
        }
        iVar14 = xferCompatibleIndex(local_70,pIVar18);
        if (iVar14 != 0) break;
        pIVar18 = pIVar18->pNext;
      }
      local_70 = local_70->pNext;
    } while (local_70 != (Index *)0x0);
  }
  if ((pDest->pCheck == (ExprList *)0x0) ||
     (iVar14 = sqlite3ExprListCompare(pTab->pCheck,pDest->pCheck,-1), iVar14 == 0)) {
    cVar11 = (char)psVar2->flags;
    if (((uint)psVar2->flags >> 0xe & 1) == 0) {
      if (cVar11 < '\0') goto LAB_00177608;
    }
    else {
      if (cVar11 < '\0') {
        return 0;
      }
      if (pDest->pFKey != (FKey *)0x0) {
        return 0;
      }
    }
    if (pTab->pSchema == (Schema *)0x0) {
      local_54 = -1000000;
    }
    else {
      local_54 = -1;
      ppSVar20 = &psVar2->aDb->pSchema;
      do {
        local_54 = local_54 + 1;
        pSVar8 = *ppSVar20;
        ppSVar20 = ppSVar20 + 4;
      } while (pSVar8 != pTab->pSchema);
    }
    p = sqlite3GetVdbe(pParse);
    sqlite3CodeVerifySchema(pParse,local_54);
    iVar14 = pParse->nTab;
    pParse->nTab = iVar14 + 2;
    iVar15 = autoIncBegin(pParse,iDbDest,pDest);
    if (pParse->nTempReg == '\0') {
      local_58 = pParse->nMem + 1;
      pParse->nMem = local_58;
    }
    else {
      bVar12 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar12;
      local_58 = pParse->aTempReg[bVar12];
    }
    iCur = iVar14 + 1;
    if (pParse->nTempReg == '\0') {
      local_64 = pParse->nMem + 1;
      pParse->nMem = local_64;
    }
    else {
      bVar12 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar12;
      local_64 = pParse->aTempReg[bVar12];
    }
    sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x6e);
    local_3c = 0;
    if (((psVar2->mDbFlags & 4) == 0) &&
       ((((pDest->iPKey < 0 && (pDest->pIndex != (Index *)0x0)) || (bVar10)) ||
        (onError - 3U < 0xfffffffe)))) {
      iVar16 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
      local_3c = sqlite3VdbeAddOp3(p,0xb,0,0,0);
      if (p->db->mallocFailed == '\0') {
        iVar19 = p->nOp + -1;
        if (-1 < iVar16) {
          iVar19 = iVar16;
        }
        pOVar21 = p->aOp + iVar19;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
    }
    if ((pTab->tabFlags & 0x20) == 0) {
      sqlite3OpenTable(pParse,iVar14,local_54,pTab,0x6d);
      local_40 = sqlite3VdbeAddOp3(p,0x24,iVar14,0,0);
      if (pDest->iPKey < 0) {
        if (pDest->pIndex == (Index *)0x0) {
          iVar16 = 0x79;
          iVar15 = iCur;
        }
        else {
          iVar16 = 0x81;
          iVar15 = iVar14;
        }
        local_50 = sqlite3VdbeAddOp3(p,iVar16,iVar15,local_64,0);
      }
      else {
        local_50 = sqlite3VdbeAddOp3(p,0x81,iVar14,local_64,0);
        iVar16 = sqlite3VdbeAddOp3(p,0x1f,iCur,0,local_64);
        sqlite3RowidConstraint(pParse,onError,pDest);
        if (p->db->mallocFailed == '\0') {
          iVar19 = p->nOp + -1;
          if (-1 < iVar16) {
            iVar19 = iVar16;
          }
          pOVar21 = p->aOp + iVar19;
        }
        else {
          pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar21->p2 = p->nOp;
        if (0 < iVar15) {
          sqlite3VdbeAddOp3(pParse->pVdbe,0x98,iVar15,local_64,0);
        }
      }
      sqlite3VdbeAddOp3(p,0x80,iVar14,local_58,1);
      uVar22 = 0x29;
      if ((psVar2->mDbFlags & 4) != 0) {
        sqlite3VdbeAddOp3(p,0x83,iCur,0,0);
        uVar22 = 0x39;
      }
      iVar15 = sqlite3VdbeAddOp3(p,0x7a,iCur,local_58,local_64);
      sqlite3VdbeChangeP4(p,iVar15,(char *)pDest,-6);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = uVar22;
      }
      sqlite3VdbeAddOp3(p,5,iVar14,local_50,0);
      sqlite3VdbeAddOp3(p,0x75,iVar14,0,0);
      sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
    }
    else {
      sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',pDest->zName);
      local_40 = 0;
      sqlite3TableLock(pParse,local_54,pTab->tnum,'\0',pTab->zName);
    }
    for (pIVar18 = pDest->pIndex; pIVar18 != (Index *)0x0; pIVar18 = pIVar18->pNext) {
      pSrc = pTab->pIndex;
      while ((pSrc != (Index *)0x0 && (iVar15 = xferCompatibleIndex(pIVar18,pSrc), iVar15 == 0))) {
        pSrc = pSrc->pNext;
      }
      sqlite3VdbeAddOp3(p,0x6d,iVar14,pSrc->tnum,local_54);
      sqlite3VdbeSetP4KeyInfo(pParse,pSrc);
      sqlite3VdbeAddOp3(p,0x6e,iCur,pIVar18->tnum,iDbDest);
      sqlite3VdbeSetP4KeyInfo(pParse,pIVar18);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 1;
      }
      uVar25 = 0;
      iVar15 = sqlite3VdbeAddOp3(p,0x24,iVar14,0,0);
      sqlite3VdbeAddOp3(p,0x80,iVar14,local_58,1);
      if ((psVar2->mDbFlags & 4) != 0) {
        uVar1 = pSrc->nColumn;
        if (uVar1 != 0) {
          ppcVar9 = pSrc->azColl;
          uVar24 = 0;
          do {
            uVar25 = uVar24;
            if ((ppcVar9[uVar24] == (char *)0x0) ||
               (iVar16 = sqlite3StrICmp("BINARY",ppcVar9[uVar24]), iVar16 != 0)) break;
            uVar24 = uVar24 + 1;
            uVar25 = (ulong)uVar1;
          } while (uVar1 != uVar24);
        }
        if ((uint)uVar25 == (uint)uVar1) {
          sqlite3VdbeAddOp3(p,0x83,iCur,0,0);
          uVar25 = 0x10;
        }
        else {
          uVar25 = 0;
        }
      }
      bVar12 = (byte)uVar25;
      if ((pTab->tabFlags & 0x20) != 0) {
        bVar12 = bVar12 | (*(ushort *)&pIVar18->field_0x63 & 3) == 2;
      }
      sqlite3VdbeAddOp3(p,0x85,iCur,local_58,0);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(bVar12 | 8);
      }
      sqlite3VdbeAddOp3(p,5,iVar14,iVar15 + 1,0);
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (p->db->mallocFailed == '\0') {
        iVar16 = p->nOp + -1;
        if (-1 < iVar15) {
          iVar16 = iVar15;
        }
        pOVar21 = p->aOp + iVar16;
      }
      pOVar21->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x75,iVar14,0,0);
      sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
    }
    if (local_40 != 0) {
      if (p->db->mallocFailed == '\0') {
        iVar14 = p->nOp + -1;
        if (-1 < local_40) {
          iVar14 = local_40;
        }
        pOVar21 = p->aOp + iVar14;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
    }
    if (local_64 != 0) {
      bVar12 = pParse->nTempReg;
      if ((ulong)bVar12 < 8) {
        pParse->nTempReg = bVar12 + 1;
        pParse->aTempReg[bVar12] = local_64;
      }
    }
    if (local_58 != 0) {
      bVar12 = pParse->nTempReg;
      if ((ulong)bVar12 < 8) {
        pParse->nTempReg = bVar12 + 1;
        pParse->aTempReg[bVar12] = local_58;
      }
    }
    if (local_3c == 0) {
      iVar14 = 1;
    }
    else {
      if (pParse->pAinc != (AutoincInfo *)0x0) {
        autoIncrementEnd(pParse);
      }
      iVar14 = 0;
      sqlite3VdbeAddOp3(p,0x45,0,0,0);
      if (p->db->mallocFailed == '\0') {
        iVar15 = p->nOp + -1;
        if (-1 < local_3c) {
          iVar15 = local_3c;
        }
        pOVar21 = p->aOp + iVar15;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
    }
  }
  else {
LAB_00177608:
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  struct SrcList_item *pItem;      /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  if( pSelect==0 ){
    return 0;   /* Must be of the form  INSERT INTO ... SELECT ... */
  }
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
  if( sqlite3TriggerList(pParse, pDest) ){
    return 0;   /* tab1 must not have triggers */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc==pDest ){
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pSrc) ){
    return 0;   /* tab2 must not be a virtual table */
  }
#endif
  if( pSrc->pSelect ){
    return 0;   /* tab2 may not be a view */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN 
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(pDestCol->zColl, pSrcCol->zColl)!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( i>0 ){
      assert( pDestCol->pDflt==0 || pDestCol->pDflt->op==TK_SPAN );
      assert( pSrcCol->pDflt==0 || pSrcCol->pDflt->op==TK_SPAN );
      if( (pDestCol->pDflt==0)!=(pSrcCol->pDflt==0) 
       || (pDestCol->pDflt && strcmp(pDestCol->pDflt->u.zToken,
                                       pSrcCol->pDflt->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM 
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization 
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      sqlite3VdbeVerifyAbortable(v, onError);
      addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
      VdbeCoverage(v);
      sqlite3RowidConstraint(pParse, onError, pDest);
      sqlite3VdbeJumpHere(v, addr2);
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|
                           OPFLAG_APPEND|OPFLAG_USESEEKRESULT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND;
    }
    sqlite3VdbeAddOp4(v, OP_Insert, iDest, regData, regRowid,
                      (char*)pDest, P4_TABLE);
    sqlite3VdbeChangeP5(v, insFlags);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted 
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key 
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user 
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      }
    }
    if( !HasRowid(pSrc) && pDestIdx->idxType==2 ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}